

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCOBBTree.cpp
# Opt level: O2

int __thiscall
chrono::collision::CHOBBTree::TraverseBoundingBoxes
          (CHOBBTree *this,
          _func_void_ChMatrix33<double>_ptr_Vector_ptr_Vector_ptr_int_void_ptr *callback,
          void *userdata)

{
  uint in_EAX;
  int iVar1;
  ulong uStack_28;
  int nboxes;
  
  uStack_28 = (ulong)in_EAX;
  if (TraverseBoundingBoxes(void(*)(chrono::ChMatrix33<double>&,chrono::ChVector<double>&,chrono::ChVector<double>&,int,void*),void*)
      ::mrot == '\0') {
    iVar1 = __cxa_guard_acquire(&TraverseBoundingBoxes(void(*)(chrono::ChMatrix33<double>&,chrono::ChVector<double>&,chrono::ChVector<double>&,int,void*),void*)
                                 ::mrot);
    if (iVar1 != 0) {
      __cxa_guard_release(&TraverseBoundingBoxes(void(*)(chrono::ChMatrix33<double>&,chrono::ChVector<double>&,chrono::ChVector<double>&,int,void*),void*)
                           ::mrot);
    }
  }
  Eigen::internal::setIdentity_impl<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_false>::run
            (&TraverseBoundingBoxes::mrot.super_Matrix<double,_3,_3,_1,_3,_3>);
  if (TraverseBoundingBoxes(void(*)(chrono::ChMatrix33<double>&,chrono::ChVector<double>&,chrono::ChVector<double>&,int,void*),void*)
      ::mpos == '\0') {
    iVar1 = __cxa_guard_acquire(&TraverseBoundingBoxes(void(*)(chrono::ChMatrix33<double>&,chrono::ChVector<double>&,chrono::ChVector<double>&,int,void*),void*)
                                 ::mpos);
    if (iVar1 != 0) {
      TraverseBoundingBoxes::mpos.m_data[2] = 0.0;
      TraverseBoundingBoxes::mpos.m_data[0] = 0.0;
      TraverseBoundingBoxes::mpos.m_data[1] = 0.0;
      __cxa_guard_release(&TraverseBoundingBoxes(void(*)(chrono::ChMatrix33<double>&,chrono::ChVector<double>&,chrono::ChVector<double>&,int,void*),void*)
                           ::mpos);
    }
  }
  TraverseBoundingBoxes::mpos.m_data[0] = VNULL;
  TraverseBoundingBoxes::mpos.m_data[1] = DAT_011dd3e0;
  TraverseBoundingBoxes::mpos.m_data[2] = DAT_011dd3e8;
  recurse_scan_OBBs(&TraverseBoundingBoxes::mrot,&TraverseBoundingBoxes::mpos,this,0,userdata,0,
                    &nboxes,callback);
  return nboxes;
}

Assistant:

int CHOBBTree::TraverseBoundingBoxes(
    void callback(ChMatrix33<>& Rot, Vector& Pos, Vector& d, int level, void* userdata),
    void* userdata) {
    int nboxes = 0;

    static ChMatrix33<> mrot;
    mrot.setIdentity();
    static Vector mpos;
    mpos = VNULL;

    recurse_scan_OBBs(mrot, mpos, this, 0, userdata, 0, nboxes, callback);

    return nboxes;
}